

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O3

unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_> __thiscall
Pl_DCT::make_compress_config(Pl_DCT *this,function<void_(jpeg_compress_struct_*)> *f)

{
  _func_int **pp_Var1;
  _Any_data local_38;
  _func_int *local_28;
  _func_int *local_20;
  
  pp_Var1 = (_func_int **)operator_new(0x28);
  std::function<void_(jpeg_compress_struct_*)>::function
            ((function<void_(jpeg_compress_struct_*)> *)&local_38,f);
  *pp_Var1 = (_func_int *)&PTR__FunctionCallbackConfig_002eb4b8;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = local_20;
  if (local_28 != (_func_int *)0x0) {
    pp_Var1[1] = (_func_int *)local_38._M_unused._0_8_;
    pp_Var1[2] = (_func_int *)local_38._8_8_;
    pp_Var1[3] = local_28;
  }
  (this->super_Pipeline)._vptr_Pipeline = pp_Var1;
  return (__uniq_ptr_data<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>,_true,_true>
          )(__uniq_ptr_data<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Pl_DCT::CompressConfig>
Pl_DCT::make_compress_config(std::function<void(jpeg_compress_struct*)> f)
{
    return std::make_unique<FunctionCallbackConfig>(f);
}